

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.c
# Opt level: O3

void nni_device(nni_aio *aio,nni_sock *s1,nni_sock *s2)

{
  int *piVar1;
  nni_sock *sock;
  _Bool _Var2;
  uint16_t uVar3;
  uint16_t uVar4;
  uint32_t uVar5;
  nni_list_node *data;
  nni_sock *pnVar6;
  nni_aio *pnVar7;
  nni_sock *sock_00;
  uint uVar8;
  nng_err result;
  long lVar9;
  ulong uVar10;
  
  nni_aio_reset(aio);
  nni_mtx_lock(&device_mtx);
  pnVar6 = s1;
  if (s1 == (nni_sock *)0x0) {
    pnVar6 = s2;
  }
  if (s2 == (nni_sock *)0x0) {
    s2 = s1;
  }
  result = NNG_EINVAL;
  if (s2 != (nni_sock *)0x0 && pnVar6 != (nni_sock *)0x0) {
    uVar3 = nni_sock_peer_id(pnVar6);
    uVar4 = nni_sock_proto_id(s2);
    if (uVar3 == uVar4) {
      uVar3 = nni_sock_peer_id(s2);
      uVar4 = nni_sock_proto_id(pnVar6);
      if (((uVar3 == uVar4) && (_Var2 = nni_sock_raw(pnVar6), _Var2)) &&
         (_Var2 = nni_sock_raw(s2), _Var2)) {
        uVar5 = nni_sock_flags(pnVar6);
        sock_00 = pnVar6;
        sock = s2;
        if ((uVar5 & 1) == 0) {
          sock_00 = s2;
          sock = pnVar6;
        }
        uVar5 = nni_sock_flags(sock_00);
        if ((uVar5 & 1) == 0) {
          nni_panic("%s: %d: assert err: %s",
                    "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/device.c"
                    ,0xaa,"(nni_sock_flags(s1) & NNI_PROTO_FLAG_RCV) != 0");
        }
        uVar5 = nni_sock_flags(sock);
        result = NNG_ENOMEM;
        data = (nni_list_node *)nni_zalloc(0x3f0);
        if (data != (nni_list_node *)0x0) {
          uVar8 = 2 - (s2 == pnVar6 || (uVar5 & 1) == 0);
          *(undefined4 *)&data->ln_prev = 0;
          pnVar7 = (nni_aio *)&data[3].ln_prev;
          uVar10 = 0;
          do {
            pnVar6 = sock;
            if (uVar10 == 0) {
              pnVar6 = sock_00;
            }
            pnVar7[-1].a_expire_node.ln_prev = &pnVar6->s_node;
            pnVar6 = sock_00;
            if (uVar10 == 0) {
              pnVar6 = sock;
            }
            pnVar7[-1].a_reap_node.rn_next = (nni_reap_node *)pnVar6;
            pnVar7[-1].a_expire_node.ln_next = data;
            *(undefined4 *)&pnVar7[-1].a_expire_q = 0;
            nni_aio_init(pnVar7,device_cb,&pnVar7[-1].a_expire_q);
            nni_aio_set_timeout(pnVar7,-1);
            uVar10 = uVar10 + 1;
            pnVar7 = (nni_aio *)&pnVar7[1].a_task;
          } while (uVar8 != uVar10);
          nni_sock_hold((nni_sock *)data[2].ln_prev);
          nni_sock_hold((nni_sock *)data[3].ln_next);
          *(uint *)&data->ln_prev = uVar8;
          _Var2 = nni_aio_start(aio,device_cancel,data);
          if (!_Var2) {
            nni_mtx_unlock(&device_mtx);
            nni_reap(&device_reap,data);
          }
          data->ln_next = (nni_list_node *)aio;
          if (0 < *(int *)&data->ln_prev) {
            pnVar7 = (nni_aio *)&data[3].ln_prev;
            lVar9 = 0;
            do {
              *(undefined4 *)&pnVar7[-1].a_expire_q = 1;
              nni_sock_recv((nni_sock *)pnVar7[-1].a_expire_node.ln_prev,pnVar7);
              piVar1 = (int *)((long)&data->ln_prev + 4);
              *piVar1 = *piVar1 + 1;
              lVar9 = lVar9 + 1;
              pnVar7 = (nni_aio *)&pnVar7[1].a_task;
            } while (lVar9 < *(int *)&data->ln_prev);
          }
          nni_mtx_unlock(&device_mtx);
          return;
        }
      }
    }
  }
  nni_mtx_unlock(&device_mtx);
  nni_aio_finish_error(aio,result);
  return;
}

Assistant:

void
nni_device(nni_aio *aio, nni_sock *s1, nni_sock *s2)
{
	device_data *d;
	int          rv;

	nni_aio_reset(aio);
	nni_mtx_lock(&device_mtx);
	if ((rv = device_init(&d, s1, s2)) != 0) {
		nni_mtx_unlock(&device_mtx);
		nni_aio_finish_error(aio, rv);
		return;
	}
	if (!nni_aio_start(aio, device_cancel, d)) {
		nni_mtx_unlock(&device_mtx);
		nni_reap(&device_reap, d);
	}
	device_start(d, aio);
	nni_mtx_unlock(&device_mtx);
}